

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeTarget
          (PipelineClient *this,Builder target)

{
  Builder builder_00;
  ClientHook *extraout_RDX;
  long in_RSI;
  Orphanage orphanage;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar1;
  Builder builder;
  undefined1 in_stack_ffffffffffffffb0 [16];
  SegmentBuilder *in_stack_ffffffffffffffc0;
  CapTableBuilder *in_stack_ffffffffffffffc8;
  undefined4 *in_stack_ffffffffffffffd0;
  
  rpc::MessageTarget::Builder::initPromisedAnswer((Builder *)&stack0xffffffffffffffc0,&target);
  *in_stack_ffffffffffffffd0 = *(undefined4 *)(*(long *)(in_RSI + 0x48) + 0x20);
  builder_00._builder.data = in_stack_ffffffffffffffc0;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_ffffffffffffffb0._0_8_;
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_ffffffffffffffb0._8_8_;
  builder_00._builder.pointers = (WirePointer *)in_stack_ffffffffffffffc8;
  builder_00._builder._32_8_ = in_stack_ffffffffffffffd0;
  orphanage = Orphanage::getForMessageContaining<capnp::rpc::PromisedAnswer::Builder>(builder_00);
  anon_unknown_18::fromPipelineOps
            ((Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)
             &stack0xffffffffffffffa0,orphanage,
             *(ArrayPtr<const_capnp::PipelineOp> *)(in_RSI + 0x50));
  rpc::PromisedAnswer::Builder::adoptTransform
            ((Builder *)&stack0xffffffffffffffc0,
             (Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)
             &stack0xffffffffffffffa0);
  OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&stack0xffffffffffffffa0);
  (this->super_RpcClient).super_ClientHook._vptr_ClientHook = (_func_int **)0x0;
  (this->super_RpcClient).super_ClientHook.brand = (void *)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      auto builder = target.initPromisedAnswer();
      builder.setQuestionId(questionRef->getId());
      builder.adoptTransform(fromPipelineOps(Orphanage::getForMessageContaining(builder), ops));
      return kj::none;
    }